

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::federateQuery_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,FederateState *fed,string_view queryStr,
          bool force_ordering)

{
  __int_type_conflict _Var1;
  value_t vVar2;
  json_value jVar3;
  size_type __pos1;
  pointer pcVar4;
  FederateStates state;
  int iVar5;
  reference pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  helics *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iVar9;
  char *__s2;
  undefined8 uVar10;
  long *__s1;
  undefined7 in_register_00000089;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar11;
  size_type __rlen;
  format_args args;
  string_view fmt;
  string_view request;
  string resultString;
  json json;
  _Alloc_hider in_stack_ffffffffffffff38;
  _Alloc_hider _Var12;
  size_type sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  data local_40;
  
  aVar11._1_7_ = in_register_00000089;
  aVar11._0_1_ = force_ordering;
  __s1 = (long *)queryStr._M_str;
  this_00 = (helics *)queryStr._M_len;
  if (fed == (FederateState *)0x0) {
    if ((this_00 == (helics *)0x6) &&
       (*(short *)((long)__s1 + 4) == 0x7374 && (int)*__s1 == 0x73697865)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      iVar9 = 0x408120;
      iVar5 = 0x408125;
      goto LAB_002fa44f;
    }
    in_stack_ffffffffffffff38._M_p = (pointer)&local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff38,"Federate not found","");
    generateJsonErrorResponse(__return_storage_ptr__,NOT_FOUND,(string *)&stack0xffffffffffffff38);
    uVar10 = local_b8._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff38._M_p == &local_b8) {
      return __return_storage_ptr__;
    }
    goto LAB_002fa502;
  }
  if ((long)this_00 < 7) {
    if (this_00 == (helics *)0x5) {
      iVar5 = bcmp(__s1,"state",5);
      if (iVar5 == 0 && !force_ordering) {
        state = FederateState::getState(fed);
        fedStateString_abi_cxx11_(state);
        args.field_1.args_ = aVar11.args_;
        args.desc_ = (unsigned_long_long)&stack0xffffffffffffff38;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x4;
        ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)0x424e32,fmt,args);
        return __return_storage_ptr__;
      }
    }
    else if (this_00 == (helics *)0x6) {
      if (*(short *)((long)__s1 + 4) == 0x7374 && (int)*__s1 == 0x73697865) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        iVar9 = 0x408443;
        iVar5 = 0x408447;
LAB_002fa44f:
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,iVar9,iVar5);
        return __return_storage_ptr__;
      }
      iVar5 = bcmp(__s1,"isinit",6);
      if (iVar5 == 0) {
        _Var1 = (fed->init_transmitted)._M_base._M_i;
        iVar9 = 0x408120;
        if ((_Var1 & 1U) != 0) {
          iVar9 = 0x408443;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        iVar5 = (_Var1 & 1 ^ 5) + iVar9;
        goto LAB_002fa44f;
      }
    }
  }
  else if (this_00 == (helics *)0x7) {
    iVar5 = bcmp(__s1,"version",7);
    if (iVar5 == 0) {
      local_a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"\"","");
      pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_a8,"3.6.1 (2025-02-24)");
      _Var12._M_p = (pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var12._M_p == paVar8) {
        local_b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_b8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        _Var12._M_p = (pointer)&local_b8;
      }
      else {
        local_b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      __pos1 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&stack0xffffffffffffff38,__pos1,0,1,'\"');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 == paVar8) {
        uVar10 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var12._M_p != &local_b8) {
        operator_delete(_Var12._M_p,(ulong)(local_b8._M_allocated_capacity + 1));
      }
      uVar10 = local_98._0_8_;
      in_stack_ffffffffffffff38._M_p = (pointer)local_a8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98) {
        return __return_storage_ptr__;
      }
      goto LAB_002fa502;
    }
  }
  else if ((this_00 == (helics *)0x12) &&
          (iVar5 = bcmp(__s1,"filtered_endpoints",0x12), iVar5 == 0 && !force_ordering)) {
    filteredEndpointQuery_abi_cxx11_(__return_storage_ptr__,this,fed);
    return __return_storage_ptr__;
  }
  local_a8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_a8._8_8_ = (object_t *)0x0;
  local_98._8_8_ =
       std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2685:55)>
       ::_M_invoke;
  local_98._0_8_ =
       std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2685:55)>
       ::_M_manager;
  request._M_str = (char *)&this->loopHandles;
  request._M_len = (size_t)__s1;
  generateInterfaceQueryResults
            ((string *)&stack0xffffffffffffff38,this_00,request,
             (HandleManager *)(ulong)(uint)(fed->global_id)._M_i.gid,
             (GlobalFederateId)(BaseType)local_a8,
             (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)in_stack_ffffffffffffff38._M_p);
  if ((code *)local_98._0_8_ != (code *)0x0) {
    (*(code *)local_98._0_8_)(local_a8,local_a8,3);
  }
  if (sStack_c0 == 0) {
    if (this_00 == (helics *)0x7) {
      __s2 = "queries";
LAB_002fa4cb:
      iVar5 = bcmp(__s1,__s2,(size_t)this_00);
      if (iVar5 == 0) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,
                   "[\"exists\",\"isinit\",\"global_state\",\"version\",\"state\",\"queries\",\"interfaces\",\"filtered_endpoints\","
                   ,"");
        FederateState::processQuery_abi_cxx11_(&local_60,fed,queryStr,false);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                       ,&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                       ,"]");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002fa4ef;
      }
    }
    else {
      if (this_00 == (helics *)0x11) {
        __s2 = "available_queries";
        goto LAB_002fa4cb;
      }
      if ((this_00 == (helics *)0xa) && ((short)__s1[1] == 0x7365 && *__s1 == 0x6361667265746e69)) {
        local_80._M_dataplus._M_p._0_4_ = (fed->global_id)._M_i.gid;
        generateInterfaceConfig_abi_cxx11_
                  ((helics *)local_a8,&this->loopHandles,(GlobalFederateId *)&local_80);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fed);
        pvVar6 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)local_a8,"name");
        vVar2 = (pvVar6->m_data).m_type;
        (pvVar6->m_data).m_type = local_40.m_type;
        jVar3 = (pvVar6->m_data).m_value;
        (pvVar6->m_data).m_value = local_40.m_value;
        local_40.m_type = vVar2;
        local_40.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_40);
        fileops::generateJsonString(__return_storage_ptr__,(json *)local_a8,true);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_a8);
        goto LAB_002fa4ef;
      }
    }
    FederateState::processQuery_abi_cxx11_(__return_storage_ptr__,fed,queryStr,force_ordering);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff38._M_p == &local_b8) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b8._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = in_stack_ffffffffffffff38._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b8._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = sStack_c0;
    local_b8._M_allocated_capacity = local_b8._M_allocated_capacity & 0xffffffffffffff00;
    in_stack_ffffffffffffff38._M_p = (pointer)&local_b8;
  }
LAB_002fa4ef:
  uVar10 = local_b8._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffff38._M_p == &local_b8) {
    return __return_storage_ptr__;
  }
LAB_002fa502:
  operator_delete(in_stack_ffffffffffffff38._M_p,(ulong)(uVar10 + 1));
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::federateQuery(const FederateState* fed,
                                      std::string_view queryStr,
                                      bool force_ordering) const
{
    if (fed == nullptr) {
        if (queryStr == "exists") {
            return "false";
        }
        return generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND, "Federate not found");
    }
    if (queryStr == "exists") {
        return "true";
    }
    if (queryStr == "version") {
        return std::string{"\""} + versionString + '"';
    }
    if (queryStr == "isinit") {
        return (fed->init_transmitted.load()) ? "true" : "false";
    }
    if (queryStr == "state") {
        if (!force_ordering) {
            return fmt::format("\"{}\"", fedStateString(fed->getState()));
        }
    }
    if (queryStr == "filtered_endpoints") {
        if (!force_ordering) {
            return filteredEndpointQuery(fed);
        }
    }
    auto resultString = generateInterfaceQueryResults(queryStr,
                                                      loopHandles,
                                                      fed->global_id,
                                                      [](nlohmann::json& /*unused*/) {});
    if (!resultString.empty()) {
        return resultString;
    }
    if (queryStr == "interfaces") {
        auto json = generateInterfaceConfig(loopHandles, fed->global_id);
        json["name"] = fed->getIdentifier();
        return fileops::generateJsonString(json);
    }
    if ((queryStr == "queries") || (queryStr == "available_queries")) {
        return std::string(
                   R"(["exists","isinit","global_state","version","state","queries","interfaces","filtered_endpoints",)") +
            fed->processQuery(queryStr) + "]";
    }
    return fed->processQuery(queryStr, force_ordering);
}